

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O3

vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
* __thiscall
Gudhi::facets<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
          (vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,Gudhi *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *vertex_range
          )

{
  _Rb_tree_node_base *p_Var1;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar2;
  Simplex f;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  _Stack_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  set<std::_Rb_tree_const_iterator<unsigned_long>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)&_Stack_58
             ,*(_Base_ptr *)(this + 0x18),(_Base_ptr)(this + 8));
  for (p_Var1 = *(_Rb_tree_node_base **)(this + 0x18); p_Var1 != (_Base_ptr)(this + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    pVar2 = std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::equal_range(&_Stack_58,(key_type *)(p_Var1 + 1));
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_erase_aux(&_Stack_58,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
    std::
    vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::allocator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>
    ::emplace_back<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>&>
              ((vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::allocator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>
                *)__return_storage_ptr__,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &_Stack_58);
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&_Stack_58,(unsigned_long *)(p_Var1 + 1));
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&_Stack_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Toplex_map::Simplex> facets(const Input_vertex_range& vertex_range) {
  std::vector<Toplex_map::Simplex> facets;
  Toplex_map::Simplex f(vertex_range.begin(), vertex_range.end());
  for (const Toplex_map::Vertex& v : vertex_range) {
    f.erase(v);
    facets.emplace_back(f);
    f.insert(v);
  }
  return facets;
}